

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O3

void __thiscall wasm::ExtractFunction::run(ExtractFunction *this,Module *module)

{
  string *errorTextIfMissing;
  char *in_R8;
  string_view sVar1;
  Name name;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"extract-function","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ExtractFunction usage:  wasm-opt --extract-function=FUNCTION_NAME"
             ,"");
  errorTextIfMissing = &local_70;
  Pass::getArgument(&local_90,&this->super_Pass,&local_50,errorTextIfMissing);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)local_90._M_dataplus._M_p;
  sVar1 = IString::interned((IString *)local_90._M_string_length,sVar1,SUB81(errorTextIfMissing,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  name.super_IString.str._M_str = in_R8;
  name.super_IString.str._M_len = (size_t)sVar1._M_str;
  wasm::extract((wasm *)(this->super_Pass).runner,(PassRunner *)module,(Module *)sVar1._M_len,name);
  return;
}

Assistant:

void run(Module* module) override {
    Name name = getArgument(
      "extract-function",
      "ExtractFunction usage:  wasm-opt --extract-function=FUNCTION_NAME");
    extract(getPassRunner(), module, name);
  }